

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_distefano_1999.h
# Opt level: O1

void __thiscall DiStefano::PerformLabeling(DiStefano *this)

{
  uint *puVar1;
  long lVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  Mat1b *pMVar6;
  long lVar7;
  Mat1i *pMVar8;
  int iVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  undefined1 uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  int *piVar26;
  uint uVar27;
  Mat local_90 [96];
  
  piVar26 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_90,*piVar26,piVar26[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar15 = (long)((*(int *)&pMVar6->field_0xc - (*(int *)&pMVar6->field_0xc + 1 >> 0x1f)) + 1 >> 1)
           * (long)((*(int *)&pMVar6->field_0x8 - (*(int *)&pMVar6->field_0x8 + 1 >> 0x1f)) + 1 >> 1
                   );
  uVar27 = 0;
  pvVar10 = operator_new__(-(ulong)(lVar15 + 1U >> 0x3e != 0) | lVar15 * 4 + 4U);
  pvVar11 = operator_new__((long)((*(int *)&pMVar6->field_0xc -
                                  (*(int *)&pMVar6->field_0xc + 1 >> 0x1f)) + 1 >> 1) *
                           (long)((*(int *)&pMVar6->field_0x8 -
                                  (*(int *)&pMVar6->field_0x8 + 1 >> 0x1f)) + 1 >> 1) + 1);
  lVar15 = (long)((*(int *)&pMVar6->field_0xc - (*(int *)&pMVar6->field_0xc + 1 >> 0x1f)) + 1 >> 1)
           * (long)((*(int *)&pMVar6->field_0x8 - (*(int *)&pMVar6->field_0x8 + 1 >> 0x1f)) + 1 >> 1
                   );
  pvVar12 = operator_new__(-(ulong)(lVar15 + 1U >> 0x3e != 0) | lVar15 * 4 + 4U);
  if (0 < *(int *)&pMVar6->field_0x8) {
    lVar15 = *(long *)&pMVar6->field_0x10;
    lVar7 = **(long **)&pMVar6->field_0x48;
    pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar20 = *(long *)&pMVar8->field_0x10;
    lVar23 = **(long **)&pMVar8->field_0x48;
    lVar24 = 0;
    uVar27 = 0;
    do {
      uVar21 = (ulong)*(uint *)&pMVar6->field_0xc;
      if (0 < (int)*(uint *)&pMVar6->field_0xc) {
        lVar25 = lVar23 * lVar24 + lVar20;
        lVar2 = lVar25 - lVar23;
        lVar18 = 0;
        do {
          if (*(char *)(lVar7 * lVar24 + lVar15 + lVar18) == '\0') {
            iVar9 = 0;
          }
          else {
            uVar22 = 0;
            uVar19 = 0;
            uVar14 = 0;
            uVar17 = 0;
            if (lVar24 != 0) {
              uVar17 = 0;
              if (lVar18 != 0) {
                uVar19 = (ulong)*(uint *)(lVar2 + -4 + lVar18 * 4);
              }
              uVar14 = *(uint *)(lVar2 + lVar18 * 4);
              if (lVar18 < (int)uVar21 + -1) {
                uVar17 = *(uint *)(lVar2 + 4 + lVar18 * 4);
              }
            }
            if (lVar18 != 0) {
              uVar22 = (ulong)*(uint *)(lVar25 + -4 + lVar18 * 4);
            }
            iVar9 = (int)uVar22;
            if (((((int)uVar19 == 0) && (uVar14 == 0)) && (uVar17 == 0)) && (iVar9 == 0)) {
              lVar13 = (long)(int)uVar27;
              uVar27 = uVar27 + 1;
              *(uint *)((long)pvVar10 + lVar13 * 4 + 4) = uVar27;
              lVar13 = lVar13 + 1;
              uVar16 = 1;
              uVar21 = (ulong)uVar27;
LAB_0017fda0:
              *(undefined1 *)((long)pvVar11 + lVar13) = uVar16;
            }
            else {
              uVar21 = (ulong)uVar14;
              if ((int)uVar19 != 0) {
                uVar21 = uVar19;
              }
              if ((int)uVar21 < 1) {
                uVar21 = (ulong)uVar17;
              }
              else if (0 < (int)uVar17) {
                iVar4 = *(int *)((long)pvVar10 + uVar21 * 4);
                iVar5 = *(int *)((long)pvVar10 + (ulong)uVar17 * 4);
                if (iVar4 != iVar5) {
                  piVar26 = (int *)((long)pvVar10 + uVar21 * 4);
                  piVar3 = (int *)((long)pvVar10 + (ulong)uVar17 * 4);
                  if (*(char *)((long)pvVar11 + (long)iVar4) == '\x01') {
                    *piVar26 = iVar5;
                    piVar26 = piVar3;
                  }
                  else {
                    if (*(char *)((long)pvVar11 + (long)iVar5) == '\0') {
                      if (0 < (int)uVar27) {
                        uVar19 = 1;
                        do {
                          if (*(int *)((long)pvVar10 + uVar19 * 4) == iVar5) {
                            *(int *)((long)pvVar10 + uVar19 * 4) = *piVar26;
                          }
                          uVar19 = uVar19 + 1;
                        } while (uVar27 + 1 != uVar19);
                      }
                      goto LAB_0017fe18;
                    }
                    *piVar3 = iVar4;
                  }
                  *(undefined1 *)((long)pvVar11 + (long)*piVar26) = 0;
                }
              }
LAB_0017fe18:
              if ((int)uVar21 < 1) goto LAB_0017fe48;
              if (0 < iVar9) {
                iVar9 = *(int *)((long)pvVar10 + uVar21 * 4);
                iVar4 = *(int *)((long)pvVar10 + uVar22 * 4);
                if (iVar9 != iVar4) {
                  if (*(char *)((long)pvVar11 + (long)iVar9) == '\x01') {
                    *(int *)((long)pvVar10 + uVar21 * 4) = iVar4;
                    iVar9 = *(int *)((long)pvVar10 + uVar22 * 4);
                  }
                  else {
                    if (*(char *)((long)pvVar11 + (long)iVar4) == '\0') {
                      if (0 < (int)uVar27) {
                        uVar22 = 1;
                        do {
                          if (*(int *)((long)pvVar10 + uVar22 * 4) == iVar4) {
                            *(undefined4 *)((long)pvVar10 + uVar22 * 4) =
                                 *(undefined4 *)((long)pvVar10 + uVar21 * 4);
                          }
                          uVar22 = uVar22 + 1;
                        } while (uVar27 + 1 != uVar22);
                      }
                      goto LAB_0017fda4;
                    }
                    *(int *)((long)pvVar10 + uVar22 * 4) = iVar9;
                    iVar9 = *(int *)((long)pvVar10 + uVar21 * 4);
                  }
                  lVar13 = (long)iVar9;
                  uVar16 = 0;
                  goto LAB_0017fda0;
                }
              }
            }
LAB_0017fda4:
            iVar9 = (int)uVar21;
          }
LAB_0017fe48:
          *(int *)(lVar25 + lVar18 * 4) = iVar9;
          lVar18 = lVar18 + 1;
          uVar21 = (ulong)*(int *)&pMVar6->field_0xc;
        } while (lVar18 < (long)uVar21);
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < *(int *)&pMVar6->field_0x8);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = 0;
  if (0 < (int)uVar27) {
    uVar14 = 0;
    uVar21 = 1;
    do {
      if (uVar21 == *(uint *)((long)pvVar10 + uVar21 * 4)) {
        uVar14 = uVar14 + 1;
        (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar14;
        *(uint *)((long)pvVar12 + uVar21 * 4) = uVar14;
      }
      uVar21 = uVar21 + 1;
    } while (uVar27 + 1 != uVar21);
  }
  if (0 < (int)uVar27) {
    uVar21 = 1;
    do {
      *(undefined4 *)((long)pvVar10 + uVar21 * 4) =
           *(undefined4 *)((long)pvVar12 + (long)*(int *)((long)pvVar10 + uVar21 * 4) * 4);
      uVar21 = uVar21 + 1;
    } while (uVar27 + 1 != uVar21);
  }
  pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  if (0 < *(int *)&pMVar8->field_0x8) {
    lVar15 = *(long *)&pMVar8->field_0x10;
    lVar7 = **(long **)&pMVar8->field_0x48;
    lVar20 = 0;
    do {
      if (0 < *(int *)&pMVar8->field_0xc) {
        lVar23 = 0;
        do {
          lVar24 = (long)*(int *)(lVar15 + lVar23 * 4);
          if (0 < lVar24) {
            *(undefined4 *)(lVar15 + lVar23 * 4) = *(undefined4 *)((long)pvVar10 + lVar24 * 4);
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 < *(int *)&pMVar8->field_0xc);
      }
      lVar20 = lVar20 + 1;
      lVar15 = lVar15 + lVar7;
    } while (lVar20 < *(int *)&pMVar8->field_0x8);
  }
  puVar1 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_;
  *puVar1 = *puVar1 + 1;
  operator_delete__(pvVar10);
  operator_delete__(pvVar11);
  operator_delete__(pvVar12);
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size());

        int i_new_label(0);

        // p q r		  p
        // s x			q x
        // lp,lq,lx: labels assigned to p,q,x

        // First scan
        int *a_class = new int[UPPER_BOUND_8_CONNECTIVITY];
        bool *a_single = new bool[UPPER_BOUND_8_CONNECTIVITY];
        int *a_renum = new int[UPPER_BOUND_8_CONNECTIVITY];

        for (int y = 0; y < img_.rows; y++) {

            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int x = 0; x < img_.cols; x++) {
                if (img_row[x]) {

                    int lp(0), lq(0), lr(0), ls(0), lx(0); // lMin(INT_MAX);
                    if (y > 0) {
                        if (x > 0)
                            lp = img_labels_row_prev[x - 1];
                        lq = img_labels_row_prev[x];
                        if (x < img_.cols - 1)
                            lr = img_labels_row_prev[x + 1];
                    }
                    if (x > 0)
                        ls = img_labels_row[x - 1];

                    // If everything around is background
                    if (lp == 0 && lq == 0 && lr == 0 && ls == 0) {
                        lx = ++i_new_label;
                        a_class[lx] = lx;
                        a_single[lx] = true;
                    }
                    else {
                        // p
                        lx = lp;
                        // q
                        if (lx == 0)
                            lx = lq;
                        // r
                        if (lx > 0) {
                            if (lr > 0 && a_class[lx] != a_class[lr]) {
                                if (a_single[a_class[lx]]) {
                                    a_class[lx] = a_class[lr];
                                    a_single[a_class[lr]] = false;
                                }
                                else if (a_single[a_class[lr]]) {
                                    a_class[lr] = a_class[lx];
                                    a_single[a_class[lx]] = false;
                                }
                                else {
                                    int i_class = a_class[lr];
                                    for (int k = 1; k <= i_new_label; k++) {
                                        if (a_class[k] == i_class) {
                                            a_class[k] = a_class[lx];
                                        }
                                    }
                                }
                            }
                        }
                        else
                            lx = lr;
                        // s
                        if (lx > 0) {
                            if (ls > 0 && a_class[lx] != a_class[ls]) {
                                if (a_single[a_class[lx]]) {
                                    a_class[lx] = a_class[ls];
                                    a_single[a_class[ls]] = false;
                                }
                                else if (a_single[a_class[ls]]) {
                                    a_class[ls] = a_class[lx];
                                    a_single[a_class[lx]] = false;
                                }
                                else {
                                    int i_class = a_class[ls];
                                    for (int k = 1; k <= i_new_label; k++) {
                                        if (a_class[k] == i_class) {
                                            a_class[k] = a_class[lx];
                                        }
                                    }
                                }
                            }
                        }
                        else
                            lx = ls;
                    }

                    img_labels_row[x] = lx;
                }
                else
                    img_labels_row[x] = 0;
            }
        }

        // Renumbering of labels
        n_labels_ = 0;
        for (int k = 1; k <= i_new_label; k++) {
            if (a_class[k] == k) {
                n_labels_++;
                a_renum[k] = n_labels_;
            }
        }
        for (int k = 1; k <= i_new_label; k++)
            a_class[k] = a_renum[a_class[k]];

        // Second scan
        for (int y = 0; y < img_labels_.rows; y++) {

            // Get rows pointer
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);

            for (int x = 0; x < img_labels_.cols; x++) {
                int iLabel = img_labels_row[x];
                if (iLabel > 0)
                    img_labels_row[x] = a_class[iLabel];
            }
        }

        n_labels_++; // To count also background

        delete[] a_class;
        delete[] a_single;
        delete[] a_renum;
    }